

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O0

void tf_apply_temporal_filter_self
               (YV12_BUFFER_CONFIG *ref_frame,MACROBLOCKD *mbd,BLOCK_SIZE block_size,int mb_row,
               int mb_col,int num_planes,uint32_t *accum,uint16_t *count)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int in_ECX;
  byte in_DL;
  MACROBLOCKD *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int pred_value;
  int idx;
  int j;
  int i;
  int pixel_idx;
  int pred_idx;
  int frame_offset;
  uint16_t *buf16;
  uint8_t *buf8;
  int frame_stride;
  int w;
  int h;
  int subsampling_x;
  int subsampling_y;
  int plane;
  int plane_offset;
  int is_high_bitdepth;
  int mb_width;
  int mb_height;
  uint local_78;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_34;
  int local_30;
  
  bVar1 = block_size_high[in_DL];
  bVar2 = block_size_wide[in_DL];
  iVar5 = is_cur_buf_hbd(in_RSI);
  local_30 = 0;
  for (local_34 = 0; local_34 < in_R9D; local_34 = local_34 + 1) {
    iVar6 = (int)(uint)bVar1 >> ((byte)in_RSI->plane[local_34].subsampling_y & 0x1f);
    iVar7 = (int)(uint)bVar2 >> ((byte)in_RSI->plane[local_34].subsampling_x & 0x1f);
    iVar3 = *(int *)(in_RDI + 0x20 + (long)(int)(uint)(local_34 != 0) * 4);
    lVar4 = *(long *)(in_RDI + 0x28 + (long)local_34 * 8);
    iVar8 = in_ECX * iVar6 * iVar3 + in_R8D * iVar7;
    local_60 = 0;
    local_64 = 0;
    for (local_68 = 0; local_68 < iVar6; local_68 = local_68 + 1) {
      for (local_6c = 0; local_6c < iVar7; local_6c = local_6c + 1) {
        iVar9 = local_30 + local_60;
        if (iVar5 == 0) {
          local_78 = (uint)*(byte *)(lVar4 + (iVar8 + local_64));
        }
        else {
          local_78 = (uint)*(ushort *)(lVar4 * 2 + (long)(iVar8 + local_64) * 2);
        }
        *(uint *)(_idx + (long)iVar9 * 4) = local_78 * 1000 + *(int *)(_idx + (long)iVar9 * 4);
        *(short *)(_i + (long)iVar9 * 2) = *(short *)(_i + (long)iVar9 * 2) + 1000;
        local_60 = local_60 + 1;
        local_64 = local_64 + 1;
      }
      local_64 = (iVar3 - iVar7) + local_64;
    }
    local_30 = iVar6 * iVar7 + local_30;
  }
  return;
}

Assistant:

static void tf_apply_temporal_filter_self(const YV12_BUFFER_CONFIG *ref_frame,
                                          const MACROBLOCKD *mbd,
                                          const BLOCK_SIZE block_size,
                                          const int mb_row, const int mb_col,
                                          const int num_planes, uint32_t *accum,
                                          uint16_t *count) {
  // Block information.
  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int is_high_bitdepth = is_cur_buf_hbd(mbd);

  int plane_offset = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    const int subsampling_y = mbd->plane[plane].subsampling_y;
    const int subsampling_x = mbd->plane[plane].subsampling_x;
    const int h = mb_height >> subsampling_y;  // Plane height.
    const int w = mb_width >> subsampling_x;   // Plane width.

    const int frame_stride = ref_frame->strides[plane == AOM_PLANE_Y ? 0 : 1];
    const uint8_t *buf8 = ref_frame->buffers[plane];
    const uint16_t *buf16 = CONVERT_TO_SHORTPTR(buf8);
    const int frame_offset = mb_row * h * frame_stride + mb_col * w;

    int pred_idx = 0;
    int pixel_idx = 0;
    for (int i = 0; i < h; ++i) {
      for (int j = 0; j < w; ++j) {
        const int idx = plane_offset + pred_idx;  // Index with plane shift.
        const int pred_value = is_high_bitdepth
                                   ? buf16[frame_offset + pixel_idx]
                                   : buf8[frame_offset + pixel_idx];
        accum[idx] += TF_WEIGHT_SCALE * pred_value;
        count[idx] += TF_WEIGHT_SCALE;
        ++pred_idx;
        ++pixel_idx;
      }
      pixel_idx += (frame_stride - w);
    }
    plane_offset += h * w;
  }
}